

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.cc
# Opt level: O0

int BUF_MEM_grow(BUF_MEM *str,size_t len)

{
  int iVar1;
  size_t len_local;
  BUF_MEM *buf_local;
  
  iVar1 = BUF_MEM_reserve((BUF_MEM *)str,len);
  if (iVar1 == 0) {
    buf_local = (BUF_MEM *)0x0;
  }
  else {
    if (str->length < len) {
      OPENSSL_memset(str->data + str->length,0,len - str->length);
    }
    str->length = len;
    buf_local = (BUF_MEM *)len;
  }
  return (int)buf_local;
}

Assistant:

size_t BUF_MEM_grow(BUF_MEM *buf, size_t len) {
  if (!BUF_MEM_reserve(buf, len)) {
    return 0;
  }
  if (buf->length < len) {
    OPENSSL_memset(&buf->data[buf->length], 0, len - buf->length);
  }
  buf->length = len;
  return len;
}